

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O0

bool handler_selective_repeat_same_allowed_proc(Am_Object *command_obj)

{
  bool bVar1;
  byte bVar2;
  Am_Value *pAVar3;
  undefined1 local_60 [8];
  Am_Object_Method method;
  undefined1 local_38 [8];
  Am_Value value;
  Am_Selective_Allowed_Method allowed_method;
  Am_Object *command_obj_local;
  
  Am_Selective_Allowed_Method::Am_Selective_Allowed_Method
            ((Am_Selective_Allowed_Method *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_38);
  do {
    bVar1 = Am_Object::Valid(command_obj);
    if (!bVar1) {
      command_obj_local._7_1_ = false;
LAB_00248020:
      Am_Value::~Am_Value((Am_Value *)local_38);
      return command_obj_local._7_1_;
    }
    pAVar3 = Am_Object::Get(command_obj,0x14c,4);
    Am_Selective_Allowed_Method::operator=((Am_Selective_Allowed_Method *)&value.value,pAVar3);
    bVar1 = Am_Selective_Allowed_Method::Valid((Am_Selective_Allowed_Method *)&value.value);
    if (bVar1) {
      Am_Object::Am_Object((Am_Object *)&method.Call,command_obj);
      bVar2 = (*(code *)allowed_method.from_wrapper)(&method.Call);
      Am_Object::~Am_Object((Am_Object *)&method.Call);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        command_obj_local._7_1_ = false;
        goto LAB_00248020;
      }
    }
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_60);
    pAVar3 = Am_Object::Get(command_obj,0x149,4);
    Am_Object_Method::operator=((Am_Object_Method *)local_60,pAVar3);
    bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_60);
    if (bVar1) {
      command_obj_local._7_1_ = true;
      goto LAB_00248020;
    }
    pAVar3 = Am_Object::Peek(command_obj,0x167,4);
    Am_Value::operator=((Am_Value *)local_38,pAVar3);
    bVar1 = Am_Value::Valid((Am_Value *)local_38);
    if ((!bVar1) || (local_38._0_2_ != 0xa001)) {
      command_obj_local._7_1_ = false;
      goto LAB_00248020;
    }
    Am_Object::operator=(command_obj,(Am_Value *)local_38);
  } while( true );
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 handler_selective_repeat_same_allowed, (Am_Object command_obj))
{
  Am_Selective_Allowed_Method allowed_method;
  Am_Value value;
  while (true) {
    if (!command_obj.Valid())
      return false;
    allowed_method =
        command_obj.Get(Am_SELECTIVE_REPEAT_SAME_ALLOWED, Am_NO_DEPENDENCY);
    if (allowed_method.Valid())
      if (!(allowed_method.Call(command_obj)))
        return false;
    Am_Object_Method method;
    method = command_obj.Get(Am_SELECTIVE_REPEAT_SAME_METHOD, Am_NO_DEPENDENCY);
    if (method.Valid())
      return true;

    value = command_obj.Peek(Am_IMPLEMENTATION_CHILD, Am_NO_DEPENDENCY);
    if (value.Valid() && value.type == Am_OBJECT)
      command_obj = value;
    else
      return false;
  }
}